

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if2.c
# Opt level: O0

int shell_(int pi,char *scriptName,char *scriptString)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  char *in_RDX;
  char *in_RSI;
  gpioExtent_t ext [2];
  int ls;
  int ln;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  gpioExtent_t *in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd8;
  
  sVar2 = strlen(in_RSI);
  sVar3 = strlen(in_RDX);
  iVar1 = pigpio_command_ext((int)sVar3,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,
                             (int)((ulong)in_RSI >> 0x20),(int)in_RSI,(int)sVar2 + 1 >> 0x1f,
                             in_stack_ffffffffffffffd0,in_stack_ffffffffffffffd8);
  return iVar1;
}

Assistant:

int shell_(int pi, char *scriptName, char *scriptString)
{
   int ln, ls;
   gpioExtent_t ext[2];

   ln = strlen(scriptName);
   ls = strlen(scriptString);
   /*
   p1=len(scriptName)
   p2=0
   p3=len(scriptName) + len(scriptString) + 1
   ## extension ##
   char[]
   */

   ext[0].size = ln + 1; /* include null byte */
   ext[0].ptr = scriptName;

   ext[1].size = ls;
   ext[1].ptr = scriptString;

   return pigpio_command_ext
      (pi, PI_CMD_SHELL, ln, 0, ln+ls+1, 2, ext, 1);
}